

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_interface_override(writer *w,TypeDef *type)

{
  char *args_2;
  bool bVar1;
  reference __in;
  TypeDef *in_RCX;
  string_view sVar2;
  pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> local_c0;
  anon_class_8_1_898e5d9c local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_98 [2];
  undefined1 local_78 [8];
  string_view type_name;
  type *info;
  type *interface_name;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
  local_50;
  iterator __end1;
  iterator __begin1;
  get_interfaces_t *__range1;
  char *format;
  TypeDef *type_local;
  writer *w_local;
  
  get_interfaces_abi_cxx11_((get_interfaces_t *)&__begin1,(cppwinrt *)w,(writer *)type,in_RCX);
  __end1 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
           ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                    *)&__begin1);
  local_50._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
          ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                 *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_50);
    if (!bVar1) break;
    __in = __gnu_cxx::
           __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
           ::operator*(&__end1);
    ::std::get<0ul,std::__cxx11::string,cppwinrt::interface_info>(__in);
    type_name._M_str = (char *)::std::get<1ul,std::__cxx11::string,cppwinrt::interface_info>(__in);
    if (((((type *)type_name._M_str)->overridable & 1U) != 0) &&
       ((((type *)type_name._M_str)->base & 1U) == 0)) {
      sVar2 = winmd::reader::TypeDef::TypeName((TypeDef *)type_name._M_str);
      type_name._M_len = (size_t)sVar2._M_str;
      local_78 = (undefined1  [8])sVar2._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (local_98,
                 "    template <typename D>\n    class %T\n    {\n        D& shim() noexcept { return *static_cast<D*>(this); }\n        D const& shim() const noexcept { return *static_cast<const D*>(this); }\n    public:\n        using % = %;\n%    };\n"
                );
      args_2 = type_name._M_str;
      winmd::reader::TypeDef::MethodList(&local_c0,(TypeDef *)type_name._M_str);
      local_a0 = bind_each<&cppwinrt::write_consume_declaration,_std::pair<winmd::reader::MethodDef,_winmd::reader::MethodDef>_>
                           (&local_c0);
      writer_base<cppwinrt::writer>::
      write<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::TypeDef,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:446:16)>
                (&w->super_writer_base<cppwinrt::writer>,local_98,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_78,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_78,(TypeDef *)args_2,
                 &local_a0);
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
             *)&__begin1);
  return;
}

Assistant:

static void write_interface_override(writer& w, TypeDef const& type)
    {
        auto format = R"(    template <typename D>
    class %T
    {
        D& shim() noexcept { return *static_cast<D*>(this); }
        D const& shim() const noexcept { return *static_cast<const D*>(this); }
    public:
        using % = %;
%    };
)";

        for (auto&& [interface_name, info] : get_interfaces(w, type))
        {
            if (info.overridable && !info.base)
            {
                auto type_name = info.type.TypeName();

                w.write(format,
                    type_name,
                    type_name,
                    info.type,
                    bind_each<write_consume_declaration>(info.type.MethodList()));
            }
        }
    }